

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O1

bool __thiscall
asio::detail::posix_event::
maybe_unlock_and_signal_one<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  ulong uVar1;
  
  if (lock->locked_ != false) {
    uVar1 = this->state_;
    this->state_ = uVar1 | 1;
    if (1 < uVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)lock->mutex_);
      lock->locked_ = false;
      pthread_cond_signal((pthread_cond_t *)this);
    }
    return 1 < uVar1;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/thirdparty/asio/detail/posix_event.hpp"
                ,0x4d,
                "bool asio::detail::posix_event::maybe_unlock_and_signal_one(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
               );
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }